

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::basic_data(basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             *this,basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *dat)

{
  bool bVar1;
  basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *dat_local;
  basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  this->type_ = dat->type_;
  std::
  unique_ptr<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>,std::default_delete<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>>
  ::
  unique_ptr<std::default_delete<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>,void>
            ((unique_ptr<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>,std::default_delete<std::unordered_map<std::__cxx11::wstring,kainjow::mustache::basic_data<std::__cxx11::wstring>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>>
              *)&this->obj_);
  std::unique_ptr<std::__cxx11::wstring,std::default_delete<std::__cxx11::wstring>>::
  unique_ptr<std::default_delete<std::__cxx11::wstring>,void>
            ((unique_ptr<std::__cxx11::wstring,std::default_delete<std::__cxx11::wstring>> *)
             &this->str_);
  std::
  unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>>,void>
            ((unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::wstring>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::wstring>>>>>
              *)&this->list_);
  std::
  unique_ptr<std::function<std::__cxx11::wstring()>,std::default_delete<std::function<std::__cxx11::wstring()>>>
  ::unique_ptr<std::default_delete<std::function<std::__cxx11::wstring()>>,void>
            ((unique_ptr<std::function<std::__cxx11::wstring()>,std::default_delete<std::function<std::__cxx11::wstring()>>>
              *)&this->partial_);
  std::
  unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>>>
  ::unique_ptr<std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>>,void>
            ((unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::wstring>>>
              *)&this->lambda_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&dat->obj_);
  if (bVar1) {
    Catch::clara::std::
    unique_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>_>
    ::operator=(&this->obj_,&dat->obj_);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&dat->str_);
    if (bVar1) {
      Catch::clara::std::
      unique_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::default_delete<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::operator=(&this->str_,&dat->str_);
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&dat->list_);
      if (bVar1) {
        Catch::clara::std::
        unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>
        ::operator=(&this->list_,&dat->list_);
      }
      else {
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&dat->partial_);
        if (bVar1) {
          Catch::clara::std::
          unique_ptr<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_()>_>_>
          ::operator=(&this->partial_,&dat->partial_);
        }
        else {
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&dat->lambda_);
          if (bVar1) {
            Catch::clara::std::
            unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
            ::operator=(&this->lambda_,&dat->lambda_);
          }
        }
      }
    }
  }
  dat->type_ = invalid;
  return;
}

Assistant:

basic_data(basic_data&& dat) : type_{dat.type_} {
        if (dat.obj_) {
            obj_ = std::move(dat.obj_);
        } else if (dat.str_) {
            str_ = std::move(dat.str_);
        } else if (dat.list_) {
            list_ = std::move(dat.list_);
        } else if (dat.partial_) {
            partial_ = std::move(dat.partial_);
        } else if (dat.lambda_) {
            lambda_ = std::move(dat.lambda_);
        }
        dat.type_ = type::invalid;
    }